

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O3

void __thiscall
chrono::ChContactContainerNSC::IntLoadResidual_CqL
          (ChContactContainerNSC *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c
          )

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = 0;
  for (p_Var2 = (this->contactlist_6_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_6_6; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_6_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_6_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_3_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_3_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_333_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_333_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_333_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_333_6; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_333_333).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_333_333; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_6; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_333).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_333; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_666).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_666; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,off_L + iVar1,R,L);
    iVar1 = iVar1 + 3;
  }
  p_Var2 = (this->contactlist_6_6_rolling).
           super__List_base<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->contactlist_6_6_rolling) {
    iVar1 = iVar1 + off_L;
    do {
      (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x28))(c,p_Var2[1]._M_next,iVar1,R,L);
      p_Var2 = p_Var2->_M_next;
      iVar1 = iVar1 + 6;
    } while (p_Var2 != (_List_node_base *)&this->contactlist_6_6_rolling);
  }
  return;
}

Assistant:

void ChContactContainerNSC::IntLoadResidual_CqL(const unsigned int off_L,
                                                ChVectorDynamic<>& R,
                                                const ChVectorDynamic<>& L,
                                                const double c) {
    unsigned int coffset = 0;
    _IntLoadResidual_CqL(coffset, contactlist_6_6, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_6_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_3_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_333_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_333_6, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_333_333, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_6, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_333, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_666, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_6_6_rolling, off_L, R, L, c, 6);
}